

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

void __thiscall icu_63::TimeZoneFormat::checkAbuttingHoursAndMinutes(TimeZoneFormat *this)

{
  UVector *this_00;
  bool bVar1;
  void *pvVar2;
  int32_t index;
  long lVar3;
  bool bVar4;
  
  this->fAbuttingOffsetHoursAndMinutes = '\0';
  lVar3 = 0;
  do {
    this_00 = this->fGMTOffsetPatternItems[lVar3];
    if (0 < this_00->count) {
      index = 0;
      bVar4 = false;
      do {
        pvVar2 = UVector::elementAt(this_00,index);
        bVar1 = !bVar4;
        if (*(int *)((long)pvVar2 + 0x10) != 0) {
          if (bVar4) {
            this->fAbuttingOffsetHoursAndMinutes = '\x01';
            bVar4 = true;
            bVar1 = false;
          }
          else {
            bVar4 = *(int *)((long)pvVar2 + 0x10) == 1;
            bVar1 = true;
          }
        }
      } while ((bVar1) && (index = index + 1, index < this_00->count));
    }
  } while ((this->fAbuttingOffsetHoursAndMinutes == '\0') && (lVar3 = lVar3 + 1, lVar3 != 6));
  return;
}

Assistant:

void
TimeZoneFormat::checkAbuttingHoursAndMinutes() {
    fAbuttingOffsetHoursAndMinutes= FALSE;
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        UBool afterH = FALSE;
        UVector *items = fGMTOffsetPatternItems[type];
        for (int32_t i = 0; i < items->size(); i++) {
            const GMTOffsetField* item = (GMTOffsetField*)items->elementAt(i);
            GMTOffsetField::FieldType fieldType = item->getType();
            if (fieldType != GMTOffsetField::TEXT) {
                if (afterH) {
                    fAbuttingOffsetHoursAndMinutes = TRUE;
                    break;
                } else if (fieldType == GMTOffsetField::HOUR) {
                    afterH = TRUE;
                }
            } else if (afterH) {
                break;
            }
        }
        if (fAbuttingOffsetHoursAndMinutes) {
            break;
        }
    }
}